

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

bool has_this(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v,VarId *s)

{
  uint32_t uVar1;
  pointer pVVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  
  pVVar2 = (v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(v->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)pVVar2 >> 4;
  puVar5 = &pVVar2->id;
  uVar3 = 0;
  do {
    uVar6 = uVar3;
    if (uVar4 == uVar6) break;
    uVar1 = *puVar5;
    puVar5 = puVar5 + 4;
    uVar3 = uVar6 + 1;
  } while (uVar1 != s->id);
  return uVar6 < uVar4;
}

Assistant:

bool has_this(vector<mir::inst::VarId> v, mir::inst::VarId s) {
  for (int i = 0; i < v.size(); i++) {
    if (v[i] == s) {
      return true;
    }
  }
  return false;
}